

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::DictionaryTypeHandlerBase<int>::IsObjTypeSpecEquivalentImpl<false>
          (DictionaryTypeHandlerBase<int> *this,Type *type,EquivalentPropertyEntry *entry)

{
  int iVar1;
  bool bVar2;
  uint16 uVar3;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  DictionaryPropertyDescriptor<int> *local_48;
  DictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *propertyRecord;
  PropertyIndex relSlotIndex;
  ScriptContext *pSStack_30;
  int absSlotIndex;
  ScriptContext *scriptContext;
  EquivalentPropertyEntry *entry_local;
  Type *type_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  scriptContext = (ScriptContext *)entry;
  entry_local = (EquivalentPropertyEntry *)type;
  type_local = (Type *)this;
  pSStack_30 = Js::Type::GetScriptContext(type);
  propertyRecord._4_4_ = 0xffff;
  propertyRecord._2_2_ = 0xffff;
  descriptor = (DictionaryPropertyDescriptor<int> *)
               ScriptContext::GetPropertyName
                         (pSStack_30,
                          *(PropertyId *)
                           &(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo);
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,(PropertyRecord **)&descriptor,&local_48);
  if ((bVar2) && ((local_48->Attributes & 8) == 0)) {
    bVar2 = DictionaryPropertyDescriptor<int>::GetIsAccessor(local_48);
    if (bVar2) {
      return false;
    }
    propertyRecord._4_4_ = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(local_48);
    if (propertyRecord._4_4_ < 0xffff) {
      propertyRecord._2_2_ =
           DynamicTypeHandler::AdjustValidSlotIndexForInlineSlots
                     (&this->super_DynamicTypeHandler,(PropertyIndex)propertyRecord._4_4_);
    }
  }
  iVar1 = propertyRecord._4_4_;
  if (propertyRecord._2_2_ == 0xffff) {
    if ((*(short *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 4) !=
         -1) || (((ulong)(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo &
                 0x100000000000000) != 0)) {
      return false;
    }
  }
  else {
    if ((propertyRecord._2_2_ !=
         *(PropertyIndex *)
          ((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 4)) ||
       (uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler),
       (int)(uint)uVar3 <= iVar1 !=
       (bool)(*(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 6)
             & 1))) {
      return false;
    }
    if ((((ulong)(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo &
         0x100000000000000) != 0) &&
       (((local_48->Attributes & 4) == 0 ||
        (bVar2 = DictionaryPropertyDescriptor<int>::IsOrMayBecomeFixed(local_48), bVar2)))) {
      return false;
    }
  }
  return true;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::IsObjTypeSpecEquivalentImpl(const Type* type, const EquivalentPropertyEntry *entry)
    {
        ScriptContext* scriptContext = type->GetScriptContext();

        T absSlotIndex = Constants::NoSlot;
        PropertyIndex relSlotIndex = Constants::NoSlot;

        const PropertyRecord* propertyRecord =
            doLock ? scriptContext->GetPropertyNameLocked(entry->propertyId) : scriptContext->GetPropertyName(entry->propertyId);
        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            // We don't object type specialize accessors at this point, so if we see an accessor on an object we must have a mismatch.
            // When we add support for accessors we will need another bit on EquivalentPropertyEntry indicating whether we expect
            // a data or accessor property.
            if (descriptor->GetIsAccessor())
            {
                return false;
            }

            absSlotIndex = descriptor->template GetDataPropertyIndex<false>();
            if (absSlotIndex <= Constants::PropertyIndexMax)
            {
                relSlotIndex = AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(absSlotIndex));
            }
        }

        if (relSlotIndex != Constants::NoSlot)
        {
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable && (!(descriptor->Attributes & PropertyWritable) || descriptor->IsOrMayBecomeFixed()))
            {
                return false;
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }